

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool HasDefaultConstructor(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  FunctionValue *__s;
  Allocator *pAVar1;
  FunctionData *pFVar2;
  ArrayView<ArgumentData> arguments_00;
  bool bVar3;
  int iVar4;
  TypeBase *pTVar5;
  undefined4 extraout_var;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ArrayView<FunctionValue> functions_00;
  FunctionValue bestOverload;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<FunctionData_*,_32U> functions;
  SmallArray<FunctionValue,_32U> overloads;
  SmallArray<ArgumentData,_32U> arguments;
  uint uStack_b3c;
  FunctionValue local_b28;
  SmallArray<unsigned_int,_32U> local_b10;
  SmallArray<FunctionData_*,_32U> local_a78;
  SmallArray<FunctionValue,_32U> local_960;
  SmallArray<ArgumentData,_32U> local_648;
  ExprBase *pEVar6;
  
  while( true ) {
    if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x13)) {
      pTVar5 = (TypeBase *)0x0;
    }
    if (pTVar5 == (TypeBase *)0x0) break;
    type = (TypeBase *)pTVar5[1]._vptr_TypeBase;
  }
  local_a78.allocator = ctx->allocator;
  local_a78.data = local_a78.little;
  local_a78.count = 0;
  local_a78.max = 0x20;
  bVar3 = GetTypeConstructorFunctions(ctx,type,true,&local_a78);
  if (bVar3) {
    pAVar1 = ctx->allocator;
    __s = local_960.little;
    memset(__s,0,0x300);
    local_960.count = 0;
    local_960.max = 0x20;
    local_960.data = __s;
    local_960.allocator = pAVar1;
    if (local_a78.count != 0) {
      uVar9 = 0;
      do {
        pFVar2 = local_a78.data[uVar9];
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar4);
        pTVar5 = pFVar2->contextType;
        pEVar6->typeID = 9;
        pEVar6->source = source;
        pEVar6->type = pTVar5;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
        if (local_960.count == local_960.max) {
          SmallArray<FunctionValue,_32U>::grow(&local_960,local_960.count);
        }
        if (local_960.data == (FunctionValue *)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]"
                       );
        }
        uVar7 = (ulong)local_960.count;
        local_960.count = local_960.count + 1;
        local_960.data[uVar7].source = source;
        local_960.data[uVar7].function = pFVar2;
        local_960.data[uVar7].context = pEVar6;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (local_a78._8_8_ & 0xffffffff));
    }
    local_b10.allocator = ctx->allocator;
    local_b10.data = local_b10.little;
    local_b10.count = 0;
    local_b10.max = 0x20;
    lVar8 = 0x20;
    do {
      *(undefined8 *)((long)local_648.little + lVar8 + -0x20) = 0;
      *(undefined1 *)((long)local_648.little + lVar8 + -0x18) = 0;
      *(undefined8 *)((long)local_648.little + lVar8 + -0x10) = 0;
      *(undefined8 *)((long)local_648.little + lVar8 + -8) = 0;
      *(undefined8 *)((long)&local_648.little[0].source + lVar8) = 0;
      *(undefined8 *)(&local_648.little[0].isExplicit + lVar8) = 0;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x620);
    local_648.data = local_648.little;
    local_648.count = 0;
    local_648.max = 0x20;
    functions_00.count = local_960.count;
    functions_00.data = local_960.data;
    arguments_00._8_8_ = (ulong)uStack_b3c << 0x20;
    arguments_00.data = local_648.data;
    functions_00._12_4_ = 0;
    local_648.allocator = local_b10.allocator;
    SelectBestFunction(&local_b28,ctx,source,functions_00,(IntrusiveList<TypeHandle>)ZEXT816(0),
                       arguments_00,&local_b10);
    bVar3 = local_b28.function != (FunctionData *)0x0;
    SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
    SmallArray<unsigned_int,_32U>::~SmallArray(&local_b10);
    SmallArray<FunctionValue,_32U>::~SmallArray(&local_960);
  }
  else {
    bVar3 = false;
  }
  SmallArray<FunctionData_*,_32U>::~SmallArray(&local_a78);
  return bVar3;
}

Assistant:

bool HasDefaultConstructor(ExpressionContext &ctx, SynBase *source, TypeBase *type)
{
	// Find array element type
	while(TypeArray *arrType = getType<TypeArray>(type))
		type = arrType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, type, true, functions))
	{
		SmallArray<FunctionValue, 32> overloads(ctx.allocator);

		for(unsigned i = 0; i < functions.size(); i++)
		{
			FunctionData *curr = functions[i];

			overloads.push_back(FunctionValue(source, curr, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, curr->contextType)));
		}

		SmallArray<unsigned, 32> ratings(ctx.allocator);
		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		if(FunctionValue bestOverload = SelectBestFunction(ctx, source, overloads, IntrusiveList<TypeHandle>(), arguments, ratings))
			return true;

		return false;
	}

	return false;
}